

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aura.c
# Opt level: O0

int aura_start_call_raw(aura_node *node,int id,
                       _func_void_aura_node_ptr_int_aura_buffer_ptr_void_ptr *calldonecb,void *arg,
                       ...)

{
  char in_AL;
  undefined8 in_R8;
  undefined8 in_R9;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  undefined1 local_118 [32];
  undefined8 local_f8;
  undefined8 local_f0;
  undefined8 local_e8;
  undefined8 local_d8;
  undefined8 local_c8;
  undefined8 local_b8;
  undefined8 local_a8;
  undefined8 local_98;
  undefined8 local_88;
  undefined8 local_78;
  aura_object *local_60;
  aura_object *o;
  aura_buffer *paStack_50;
  int ret;
  aura_buffer *buf;
  va_list ap;
  void *arg_local;
  _func_void_aura_node_ptr_int_aura_buffer_ptr_void_ptr *calldonecb_local;
  int id_local;
  aura_node *node_local;
  
  if (in_AL != '\0') {
    local_e8 = in_XMM0_Qa;
    local_d8 = in_XMM1_Qa;
    local_c8 = in_XMM2_Qa;
    local_b8 = in_XMM3_Qa;
    local_a8 = in_XMM4_Qa;
    local_98 = in_XMM5_Qa;
    local_88 = in_XMM6_Qa;
    local_78 = in_XMM7_Qa;
  }
  local_f8 = in_R8;
  local_f0 = in_R9;
  ap[0].reg_save_area = arg;
  local_60 = aura_etable_find_id(node->tbl,id);
  if (local_60 == (aura_object *)0x0) {
    node_local._4_4_ = -0x39;
  }
  else {
    ap[0].overflow_arg_area = local_118;
    ap[0]._0_8_ = &stack0x00000008;
    buf._4_4_ = 0x30;
    buf._0_4_ = 0x20;
    paStack_50 = aura_serialize(node,local_60->arg_fmt,local_60->arglen,(__va_list_tag *)&buf);
    if (paStack_50 == (aura_buffer *)0x0) {
      node_local._4_4_ = -0x3d;
    }
    else {
      o._4_4_ = aura_core_start_call(node,local_60,calldonecb,ap[0].reg_save_area,paStack_50);
      if (o._4_4_ != 0) {
        aura_buffer_release(paStack_50);
      }
      node_local._4_4_ = o._4_4_;
    }
  }
  return node_local._4_4_;
}

Assistant:

int aura_start_call_raw(
	struct aura_node *node,
	int id,
	void (*calldonecb)(struct aura_node *dev, int status, struct aura_buffer *ret, void *arg),
	void *arg,
	...)
{
	va_list ap;
	struct aura_buffer *buf;
	int ret;

	struct aura_object *o = aura_etable_find_id(node->tbl, id);

	if (!o)
		return -EBADSLT;

	va_start(ap, arg);
	buf = aura_serialize(node, o->arg_fmt, o->arglen, ap);
	va_end(ap);

	if (!buf)
		return -ENODATA;

	ret = aura_core_start_call(node, o, calldonecb, arg, buf);

	if (ret != 0)
		aura_buffer_release(buf);

	return ret;
}